

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O2

void bench_field_half(void *arg,int iters)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 0;
  if (0 < iters) {
    iVar1 = iters;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_fe_impl_half((secp256k1_fe *)((long)arg + 0x40));
  }
  return;
}

Assistant:

static void bench_field_half(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        secp256k1_fe_half(&data->fe[0]);
    }
}